

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O2

void __thiscall CompoundFile::MSAT::loadMSAT(MSAT *this)

{
  int iVar1;
  bool bVar2;
  SecID id;
  _Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_38;
  
  loadFirst109SecIDs((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&local_38,
                     this->m_stream);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
            (&this->m_msat,&local_38);
  std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
            (&local_38);
  iVar1 = this->m_header->m_sectorsInMSAT;
  local_38._M_impl.super__Vector_impl_data._M_start._0_4_ = (this->m_header->m_msatFirstSecID).m_id;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::istream::seekg(this->m_stream,
                        (long)(int32_t)local_38._M_impl.super__Vector_impl_data._M_start *
                        (long)this->m_header->m_sectorSize + 0x200,0);
    loadMSATSector(this->m_stream,&this->m_msat,(SecID *)&local_38,this->m_header->m_sectorSize);
  }
  return;
}

Assistant:

inline void
MSAT::loadMSAT()
{
	m_msat = loadFirst109SecIDs( m_stream );

	const int32_t msatSectorsCount = m_header.sectorsInMSAT();

	SecID id = m_header.msatFirstSecID();

	for( int32_t i = 0; i < msatSectorsCount; ++i )
	{
		m_stream.seekg( calcFileOffset( id, m_header.sectorSize() ) );

		loadMSATSector( m_stream, m_msat, id, m_header.sectorSize() );
	}
}